

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_maputl.cpp
# Opt level: O1

int AF_DBlockThingsIterator_Create
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  double checkradius;
  PClass *pPVar1;
  int iVar2;
  undefined4 extraout_var;
  PClass *pPVar3;
  VMValue *pVVar4;
  DBlockThingsIterator *this;
  char *pcVar5;
  AActor *origin;
  bool bVar6;
  
  if (numparam < 1) {
    pcVar5 = "(paramnum) < numparam";
  }
  else {
    if (((param->field_0).field_3.Type == '\x03') &&
       (((param->field_0).field_1.atag == 1 || ((param->field_0).field_1.a == (void *)0x0)))) {
      origin = (AActor *)(param->field_0).field_1.a;
      if (origin == (AActor *)0x0) {
        NullParam("\"origin\"");
        origin = (AActor *)(param->field_0).field_1.a;
      }
      pPVar1 = AActor::RegistrationInfo.MyClass;
      if (origin != (AActor *)0x0) {
        if ((origin->super_DThinker).super_DObject.Class == (PClass *)0x0) {
          iVar2 = (**(origin->super_DThinker).super_DObject._vptr_DObject)(origin);
          (origin->super_DThinker).super_DObject.Class = (PClass *)CONCAT44(extraout_var,iVar2);
        }
        pPVar3 = (origin->super_DThinker).super_DObject.Class;
        bVar6 = pPVar3 != (PClass *)0x0;
        if (pPVar3 != pPVar1 && bVar6) {
          do {
            pPVar3 = pPVar3->ParentClass;
            bVar6 = pPVar3 != (PClass *)0x0;
            if (pPVar3 == pPVar1) break;
          } while (pPVar3 != (PClass *)0x0);
        }
        if (!bVar6) {
          pcVar5 = "origin == NULL || origin->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_0041cb2e;
        }
      }
      if (numparam == 1) {
        pVVar4 = defaultparam->Array;
        if (defaultparam->Array[1].field_0.field_3.Type != '\x01') {
          pcVar5 = "(defaultparam[paramnum]).Type == REGT_FLOAT";
LAB_0041cb6c:
          __assert_fail(pcVar5,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_maputl.cpp"
                        ,0x4b9,
                        "int AF_DBlockThingsIterator_Create(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
      }
      else {
        pVVar4 = param;
        if (param[1].field_0.field_3.Type != '\x01') {
          pcVar5 = "(param[paramnum]).Type == REGT_FLOAT";
          goto LAB_0041cb6c;
        }
      }
      checkradius = pVVar4[1].field_0.f;
      if (numparam < 3) {
        param = defaultparam->Array;
        if (param[2].field_0.field_3.Type == '\0') goto LAB_0041caaa;
        pcVar5 = "(defaultparam[paramnum]).Type == REGT_INT";
      }
      else {
        if (param[2].field_0.field_3.Type == '\0') {
LAB_0041caaa:
          iVar2 = param[2].field_0.i;
          this = (DBlockThingsIterator *)
                 M_Malloc_Dbg(0x218,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/dobject.h"
                              ,0x1f9);
          DBlockThingsIterator::DBlockThingsIterator(this,origin,checkradius,iVar2 != 0);
          if (numret < 1) {
            iVar2 = 0;
          }
          else {
            if (ret == (VMReturn *)0x0) {
              __assert_fail("ret != NULL",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_maputl.cpp"
                            ,0x4bb,
                            "int AF_DBlockThingsIterator_Create(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                           );
            }
            iVar2 = 1;
            VMReturn::SetPointer(ret,this,1);
          }
          return iVar2;
        }
        pcVar5 = "(param[paramnum]).Type == REGT_INT";
      }
      __assert_fail(pcVar5,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_maputl.cpp"
                    ,0x4ba,
                    "int AF_DBlockThingsIterator_Create(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    pcVar5 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
  }
LAB_0041cb2e:
  __assert_fail(pcVar5,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_maputl.cpp"
                ,0x4b8,
                "int AF_DBlockThingsIterator_Create(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
               );
}

Assistant:

DEFINE_ACTION_FUNCTION(DBlockThingsIterator, Create)
{
	PARAM_PROLOGUE;
	PARAM_OBJECT_NOT_NULL(origin, AActor);
	PARAM_FLOAT_DEF(radius);
	PARAM_BOOL_DEF(ignore);
	ACTION_RETURN_OBJECT(new DBlockThingsIterator(origin, radius, ignore));
}